

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

void __thiscall Js::ConfigFlagsTable::SetAllParentFlagsAsDefaultValue(ConfigFlagsTable *this)

{
  code *pcVar1;
  bool bVar2;
  Boolean value;
  FlagTypes FVar3;
  undefined4 *puVar4;
  char *this_00;
  Flag flag;
  ulong uVar5;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar5 = 0;
  do {
    if (this->flagIsParent[uVar5] == true) {
      flag = (Flag)uVar5;
      this_00 = (char *)(uVar5 & 0xffff);
      FVar3 = GetFlagType(flag);
      if (FVar3 != FlagBoolean) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        this_00 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
        ;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                    ,0x1c4,"(this->GetFlagType(currentFlag) == FlagBoolean)",
                                    "only supporting boolean flags as parent flags");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      value = GetDefaultValueAsBoolean((ConfigFlagsTable *)this_00,flag);
      SetAsBoolean(this,flag,value);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x1d6);
  return;
}

Assistant:

void
    ConfigFlagsTable::SetAllParentFlagsAsDefaultValue()
    {
        for (int i = 0; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag) i;
            if (this->IsParentFlag(currentFlag))
            {
                // only supporting Boolean for now
                AssertMsg(this->GetFlagType(currentFlag) == FlagBoolean, "only supporting boolean flags as parent flags");

                Boolean defaultParentValue = this->GetDefaultValueAsBoolean(currentFlag);
                this->SetAsBoolean(currentFlag, defaultParentValue);
            }
        }
    }